

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O3

void dsfmt_fill_array_open_open(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint64_t t0;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint64_t t1;
  ulong uVar15;
  uint64_t t1_2;
  ulong uVar16;
  ulong uVar17;
  uint64_t uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x231,"void dsfmt_fill_array_open_open(dsfmt_t *, double *, int)");
  }
  if (size < 0x17e) {
    __assert_fail("size >= DSFMT_N64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x232,"void dsfmt_fill_array_open_open(dsfmt_t *, double *, int)");
  }
  auVar4 = *(undefined1 (*) [16])dsfmt->status[0].u;
  auVar22._0_8_ = auVar4._0_8_ << 0x13;
  auVar22._8_8_ = auVar4._8_8_ << 0x13;
  auVar20._4_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf8);
  auVar20._0_4_ = *(undefined4 *)((long)dsfmt->status + 0xbfc);
  auVar20._8_4_ = *(undefined4 *)((long)dsfmt->status + 0xbf4);
  auVar20._12_4_ = dsfmt->status[0xbf].u32[0];
  auVar20 = auVar20 ^ auVar22 ^ (undefined1  [16])dsfmt->status[0x75];
  uVar12 = auVar20._8_8_;
  auVar21._0_8_ = auVar20._0_8_ >> 0xc;
  auVar21._8_8_ = uVar12 >> 0xc;
  *(undefined1 (*) [16])array = auVar21 ^ auVar4 ^ _DAT_00132010 & auVar20;
  lVar14 = 0;
  uVar15 = auVar20._0_8_;
  do {
    uVar9 = *(ulong *)((long)dsfmt->status + lVar14 + 0x10);
    uVar17 = *(ulong *)((long)dsfmt->status + lVar14 + 0x18);
    uVar16 = (uVar12 << 0x20 | uVar12 >> 0x20) ^ uVar9 << 0x13 ^
             *(ulong *)((long)dsfmt->status + lVar14 + 0x760);
    uVar12 = (uVar15 << 0x20 | uVar15 >> 0x20) ^ uVar17 << 0x13 ^
             *(ulong *)((long)dsfmt->status + lVar14 + 0x768);
    *(ulong *)((long)array + lVar14 + 0x10) = uVar16 & 0xffafffffffb3f ^ uVar16 >> 0xc ^ uVar9;
    *(ulong *)((long)array + lVar14 + 0x18) = uVar12 & 0xffdfffc90fffd ^ uVar12 >> 0xc ^ uVar17;
    lVar14 = lVar14 + 0x10;
    uVar15 = uVar16;
  } while (lVar14 != 0x490);
  lVar14 = 0;
  do {
    uVar15 = *(ulong *)((long)dsfmt->status + lVar14 + 0x4a0);
    uVar9 = *(ulong *)((long)dsfmt->status + lVar14 + 0x4a8);
    uVar17 = (uVar12 << 0x20 | uVar12 >> 0x20) ^ uVar15 << 0x13 ^ *(ulong *)((long)array + lVar14);
    uVar12 = (uVar16 << 0x20 | uVar16 >> 0x20) ^ uVar9 << 0x13 ^
             *(ulong *)((long)array + lVar14 + 8);
    *(ulong *)((long)array + lVar14 + 0x4a0) = uVar17 & 0xffafffffffb3f ^ uVar17 >> 0xc ^ uVar15;
    *(ulong *)((long)array + lVar14 + 0x4a8) = uVar12 & 0xffdfffc90fffd ^ uVar12 >> 0xc ^ uVar9;
    lVar14 = lVar14 + 0x10;
    uVar16 = uVar17;
  } while (lVar14 != 0x750);
  uVar13 = (uint)size >> 1;
  uVar10 = 0xbf;
  if (0x2fc < (uint)size) {
    uVar10 = uVar13 - 0xbf;
    lVar14 = 0;
    do {
      uVar9 = uVar17 << 0x20;
      uVar16 = uVar17 >> 0x20;
      uVar5 = ((ulong *)((long)array + lVar14))[1];
      uVar17 = *(ulong *)((long)array + lVar14) << 0x13 ^ (uVar12 << 0x20 | uVar12 >> 0x20) ^
               *(ulong *)((long)array + lVar14 + 0x750);
      uVar15 = *(ulong *)((long)array + lVar14 + 8);
      uVar12 = uVar15 << 0x13 ^ (uVar9 | uVar16) ^ *(ulong *)((long)array + lVar14 + 0x758);
      *(ulong *)((long)array + lVar14 + 0xbf0) =
           uVar17 & 0xffafffffffb3f ^ uVar17 >> 0xc ^ *(ulong *)((long)array + lVar14);
      *(ulong *)((long)array + lVar14 + 0xbf8) = uVar12 & 0xffdfffc90fffd ^ uVar12 >> 0xc ^ uVar15;
      *(double *)((long)array + lVar14) = (double)(*(ulong *)((long)array + lVar14) | 1) + -1.0;
      ((double *)((long)array + lVar14))[1] = (double)(uVar5 | 1) + -1.0;
      lVar14 = lVar14 + 0x10;
    } while ((ulong)uVar10 * 0x10 + -0xbf0 != lVar14);
  }
  uVar15 = (ulong)uVar13;
  if ((uint)size < 0x2fc) {
    uVar9 = 1;
    if (1 < (int)(0x17e - uVar13)) {
      uVar9 = (ulong)(0x17e - uVar13);
    }
    lVar14 = 0;
    do {
      puVar1 = (undefined8 *)((long)array + lVar14 + uVar15 * 0x10 + -0xbf0);
      uVar7 = puVar1[1];
      puVar3 = (undefined8 *)((long)dsfmt->status + lVar14);
      *puVar3 = *puVar1;
      puVar3[1] = uVar7;
      lVar14 = lVar14 + 0x10;
    } while (uVar9 << 4 != lVar14);
  }
  else {
    uVar9 = 0;
  }
  if ((int)uVar10 < (int)uVar13) {
    uVar16 = (ulong)uVar10;
    lVar11 = uVar15 - uVar16;
    lVar14 = uVar16 * 0x10 + -0xbf0;
    lVar19 = 0;
    uVar18 = uVar17;
    do {
      uVar5 = *(ulong *)((long)array + lVar19 + lVar14);
      uVar6 = *(ulong *)((long)array + lVar19 + uVar16 * 0x10 + -0xbe8);
      uVar17 = (uVar12 << 0x20 | uVar12 >> 0x20) ^ uVar5 << 0x13 ^
               *(ulong *)((long)array + lVar19 + uVar16 * 0x10 + -0x4a0);
      uVar12 = (uVar18 << 0x20 | uVar18 >> 0x20) ^ uVar6 << 0x13 ^
               *(ulong *)((long)array + lVar19 + uVar16 * 0x10 + -0x498);
      *(ulong *)((long)array + lVar19 + uVar16 * 0x10) =
           uVar17 & 0xffafffffffb3f ^ uVar17 >> 0xc ^ uVar5;
      *(ulong *)((long)array + lVar19 + uVar16 * 0x10 + 8) =
           uVar12 & 0xffdfffc90fffd ^ uVar12 >> 0xc ^ uVar6;
      puVar3 = (undefined8 *)((long)array + lVar19 + uVar16 * 0x10);
      uVar7 = puVar3[1];
      puVar1 = (undefined8 *)((long)dsfmt->status + lVar19 + uVar9 * 0x10);
      *puVar1 = *puVar3;
      puVar1[1] = uVar7;
      puVar2 = (ulong *)((long)array + lVar19 + lVar14);
      uVar5 = puVar2[1];
      pdVar8 = (double *)((long)array + lVar19 + lVar14);
      *pdVar8 = (double)(*puVar2 | 1) + -1.0;
      pdVar8[1] = (double)(uVar5 | 1) + -1.0;
      lVar19 = lVar19 + 0x10;
      lVar11 = lVar11 + -1;
      uVar18 = uVar17;
    } while (lVar11 != 0);
  }
  lVar14 = (uVar15 - uVar13) + 0xbf;
  pdVar8 = array + (ulong)uVar13 * 2 + -0x17e;
  do {
    *pdVar8 = (double)((ulong)*pdVar8 | 1) + -1.0;
    pdVar8[1] = (double)((ulong)pdVar8[1] | 1) + -1.0;
    pdVar8 = pdVar8 + 2;
    lVar14 = lVar14 + -1;
  } while (lVar14 != 0);
  dsfmt->status[0xbf].u[0] = uVar17;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar12;
  return;
}

Assistant:

void dsfmt_fill_array_open_open(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_o0o1(dsfmt, (w128_t *)array, size / 2);
}